

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

amrex_parser * amrex::parser_dup(amrex_parser *source)

{
  amrex_parser *paVar1;
  void *pvVar2;
  parser_node *ppVar3;
  long in_RDI;
  amrex_parser *dest;
  int in_stack_00000054;
  parser_node *in_stack_00000058;
  amrex_parser *in_stack_00000060;
  
  paVar1 = (amrex_parser *)malloc(0x20);
  paVar1->sz_mempool = *(size_t *)(in_RDI + 0x18);
  pvVar2 = malloc(paVar1->sz_mempool);
  paVar1->p_root = pvVar2;
  paVar1->p_free = paVar1->p_root;
  ppVar3 = parser_ast_dup(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  paVar1->ast = ppVar3;
  return paVar1;
}

Assistant:

struct amrex_parser*
parser_dup (struct amrex_parser* source)
{
    struct amrex_parser* dest = (struct amrex_parser*) std::malloc(sizeof(struct amrex_parser));
    dest->sz_mempool = source->sz_mempool;
    dest->p_root = std::malloc(dest->sz_mempool);
    dest->p_free = dest->p_root;

    dest->ast = parser_ast_dup(dest, source->ast, 0); /* 0: don't free the source */

    return dest;
}